

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Processor::Processor
          (Processor *this,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  CodeLocation local_38;
  Context *local_28;
  Context *processorName_local;
  CodeLocation *processorKeyword_local;
  Processor *this_local;
  Identifier moduleName_local;
  
  local_28 = processorName;
  processorName_local = (Context *)processorKeyword;
  processorKeyword_local = (CodeLocation *)this;
  this_local = (Processor *)moduleName.name;
  CodeLocation::CodeLocation(&local_38,processorKeyword);
  ProcessorBase::ProcessorBase
            (&this->super_ProcessorBase,Processor,&local_38,local_28,(Identifier)this_local);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Processor_005864d8;
  (this->super_ProcessorBase).super_ModuleBase.super_Scope._vptr_Scope =
       (_func_int **)&PTR__Processor_005865a8;
  pool_ptr<soul::AST::Expression>::pool_ptr(&this->latency);
  std::
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  ::vector(&this->functions);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::vector(&this->stateVariables);
  return;
}

Assistant:

Processor (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ProcessorBase (ObjectType::Processor, processorKeyword, processorName, moduleName) {}